

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O3

gkc_summary * gkc_combine(gkc_summary *s1,gkc_summary *s2)

{
  list *plVar1;
  gkc_summary *s;
  gkc_tuple *pgVar2;
  ulong uVar3;
  list *plVar4;
  list *plVar5;
  list *plVar6;
  list *plVar7;
  list *plVar8;
  list *plVar9;
  list *plVar10;
  double dVar11;
  
  dVar11 = s1->epsilon;
  if ((dVar11 != s2->epsilon) || (NAN(dVar11) || NAN(s2->epsilon))) {
    s = (gkc_summary *)0x0;
  }
  else {
    s = (gkc_summary *)calloc(1,0x38);
    (s->head).next = &s->head;
    (s->head).prev = &s->head;
    s->epsilon = dVar11;
    plVar8 = (s1->head).next;
    plVar10 = &s1->head;
    plVar7 = (s2->head).next;
    plVar9 = &s2->head;
    plVar6 = plVar7;
    if (plVar7 != plVar9 && plVar8 != plVar10) {
      do {
        pgVar2 = gkc_alloc(s);
        plVar4 = plVar6[-2].next;
        if (plVar8[-2].next < plVar4) {
          plVar4 = plVar8[-2].next;
          plVar5 = plVar8;
          plVar7 = plVar6;
          plVar8 = plVar8->next;
        }
        else {
          plVar7 = plVar6->next;
          plVar5 = plVar6;
        }
        plVar1 = plVar5[-1].next;
        plVar6 = plVar5[-1].prev;
        pgVar2->value = (uint64_t)plVar4;
        pgVar2->g = (double)plVar6;
        pgVar2->delta = (uint64_t)plVar1;
        plVar4 = (s->head).prev;
        plVar5 = plVar4->next;
        (pgVar2->node).next = plVar5;
        plVar5->prev = &pgVar2->node;
        plVar4->next = &pgVar2->node;
        (pgVar2->node).prev = plVar4;
        dVar11 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25)
                 + ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) +
                 (double)plVar6;
        uVar3 = (ulong)dVar11;
        s->nr_elems = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      } while ((plVar8 != plVar10) && (plVar6 = plVar7, plVar7 != plVar9));
    }
    for (; plVar8 != plVar10; plVar8 = plVar8->next) {
      pgVar2 = gkc_alloc(s);
      pgVar2->value = (uint64_t)plVar8[-2].next;
      plVar6 = plVar8[-1].prev;
      pgVar2->g = (double)plVar6;
      pgVar2->delta = (uint64_t)plVar8[-1].next;
      plVar4 = (s->head).prev;
      plVar5 = plVar4->next;
      (pgVar2->node).next = plVar5;
      plVar5->prev = &pgVar2->node;
      plVar4->next = &pgVar2->node;
      (pgVar2->node).prev = plVar4;
      dVar11 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) + (double)plVar6
      ;
      uVar3 = (ulong)dVar11;
      s->nr_elems = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    }
    for (; plVar7 != plVar9; plVar7 = plVar7->next) {
      pgVar2 = gkc_alloc(s);
      pgVar2->value = (uint64_t)plVar7[-2].next;
      plVar8 = plVar7[-1].prev;
      pgVar2->g = (double)plVar8;
      pgVar2->delta = (uint64_t)plVar7[-1].next;
      plVar6 = (s->head).prev;
      plVar10 = plVar6->next;
      (pgVar2->node).next = plVar10;
      plVar10->prev = &pgVar2->node;
      plVar6->next = &pgVar2->node;
      (pgVar2->node).prev = plVar6;
      dVar11 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0) + (double)plVar8
      ;
      uVar3 = (ulong)dVar11;
      s->nr_elems = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    }
    s->max_alloced = s->alloced;
    gkc_compress(s);
  }
  return s;
}

Assistant:

struct gkc_summary *gkc_combine(struct gkc_summary *s1, struct gkc_summary *s2)
{
    struct gkc_summary *snew;
    struct list *cur1, *cur2;
    struct gkc_tuple *tcur1, *tcur2, *tnew;

    if (s1->epsilon != s2->epsilon) {
        return NULL;
    }
    snew = gkc_summary_alloc(s1->epsilon);

    cur1 = s1->head.next;
    cur2 = s2->head.next;
    while (cur1 != &s1->head && cur2 != &s2->head) {
        tcur1 = list_to_tuple(cur1);
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        if (tcur1->value < tcur2->value) {
            tnew->value = tcur1->value;
            tnew->g = tcur1->g;
            tnew->delta = tcur1->delta;
            cur1 = cur1->next;
        } else {
            tnew->value = tcur2->value;
            tnew->g = tcur2->g;
            tnew->delta = tcur2->delta;
            cur2 = cur2->next;
        }
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
    }
    while (cur1 != &s1->head) {
        tcur1 = list_to_tuple(cur1);

        tnew = gkc_alloc(snew);
        tnew->value = tcur1->value;
        tnew->g = tcur1->g;
        tnew->delta = tcur1->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur1 = cur1->next;
    }
    while (cur2 != &s2->head) {
        tcur2 = list_to_tuple(cur2);

        tnew = gkc_alloc(snew);
        tnew->value = tcur2->value;
        tnew->g = tcur2->g;
        tnew->delta = tcur2->delta;
        list_add_tail(&snew->head, &tnew->node);
        snew->nr_elems += tnew->g;
        cur2 = cur2->next;
    }
    snew->max_alloced = snew->alloced;
    gkc_compress(snew);

    return snew;
}